

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  stbi_uc sVar7;
  int iVar8;
  stbi__uint32 sVar9;
  stbi__uint32 sVar10;
  uint uVar11;
  int depth;
  int iVar12;
  char *pcVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  uint uVar16;
  int iVar17;
  int *piVar18;
  ulong uVar19;
  stbi_uc *psVar20;
  ushort uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int out_n;
  uint x;
  long lVar25;
  byte bVar26;
  uint y_00;
  uint uVar27;
  long lVar28;
  uint color;
  ulong uVar29;
  size_t sVar30;
  long *in_FS_OFFSET;
  bool bVar31;
  stbi_uc tc [3];
  stbi__uint16 tc16 [3];
  stbi__uint32 raw_len;
  ulong local_458;
  long local_450;
  stbi_uc *local_448;
  long local_440;
  stbi_uc palette [1024];
  
  tc[0] = '\0';
  tc[1] = '\0';
  tc[2] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar8 = stbi__check_png_header(s);
  if (iVar8 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar31 = true;
  bVar5 = 0;
  color = 0;
  bVar3 = false;
  uVar23 = 0;
  uVar11 = 0;
  uVar27 = 0;
  bVar4 = false;
  bVar26 = 0;
LAB_0013c8bc:
  sVar9 = stbi__get32be(s);
  uVar19 = (ulong)sVar9;
  sVar10 = stbi__get32be(s);
  if (sVar10 == 0x43674249) {
    bVar3 = true;
LAB_0013ca2b:
    stbi__skip(s,sVar9);
  }
  else if (sVar10 == 0x49444154) {
    if (bVar31) goto LAB_0013cd0a;
    if ((bVar26 != 0) && (uVar23 == 0)) {
      pcVar13 = "no PLTE";
      goto LAB_0013cd11;
    }
    if (scan == 2) {
      s->img_n = (uint)bVar26;
      return 1;
    }
    uVar24 = uVar27 + sVar9;
    if ((int)uVar24 < (int)uVar27) {
      return 0;
    }
    if (uVar11 < uVar24) {
      if (sVar9 < 0x1001) {
        uVar19 = 0x1000;
      }
      if (uVar11 != 0) {
        uVar19 = (ulong)uVar11;
      }
      do {
        sVar30 = uVar19;
        uVar11 = (uint)sVar30;
        uVar19 = (ulong)(uVar11 * 2);
      } while (uVar11 < uVar24);
      psVar14 = (stbi_uc *)realloc(*ppsVar1,sVar30);
      if (psVar14 == (stbi_uc *)0x0) goto LAB_0013d413;
      *ppsVar1 = psVar14;
    }
    else {
      psVar14 = *ppsVar1;
    }
    iVar8 = stbi__getn(s,psVar14 + uVar27,sVar9);
    if (iVar8 == 0) {
      pcVar13 = "outofdata";
      goto LAB_0013cd11;
    }
    bVar31 = false;
    uVar27 = uVar24;
  }
  else {
    if (sVar10 != 0x49484452) {
      if (sVar10 == 0x504c5445) {
        if (!bVar31) {
          if ((sVar9 < 0x301) && (uVar23 = (sVar9 & 0xffff) / 3, uVar23 * 3 == sVar9)) {
            for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
              sVar7 = stbi__get8(s);
              palette[uVar19 * 4] = sVar7;
              sVar7 = stbi__get8(s);
              palette[uVar19 * 4 + 1] = sVar7;
              sVar7 = stbi__get8(s);
              palette[uVar19 * 4 + 2] = sVar7;
              palette[uVar19 * 4 + 3] = 0xff;
            }
            bVar31 = false;
            goto LAB_0013ccd0;
          }
          pcVar13 = "invalid PLTE";
          goto LAB_0013cd11;
        }
      }
      else if (sVar10 == 0x74524e53) {
        if (!bVar31) {
          if (*ppsVar1 != (stbi_uc *)0x0) {
            pcVar13 = "tRNS after IDAT";
            goto LAB_0013cd11;
          }
          if (bVar26 == 0) {
            uVar24 = s->img_n;
            if ((uVar24 & 1) != 0) {
              if (uVar24 * 2 != sVar9) goto LAB_0013cd7a;
              if (z->depth == 0x10) {
                for (lVar28 = 0; lVar28 < (int)uVar24; lVar28 = lVar28 + 1) {
                  iVar8 = stbi__get16be(s);
                  tc16[lVar28] = (stbi__uint16)iVar8;
                  uVar24 = s->img_n;
                }
              }
              else {
                for (lVar28 = 0; lVar28 < (int)uVar24; lVar28 = lVar28 + 1) {
                  iVar8 = stbi__get16be(s);
                  tc[lVar28] = ""[z->depth] * (char)iVar8;
                  uVar24 = s->img_n;
                }
              }
              bVar4 = true;
              bVar31 = false;
              bVar26 = 0;
              goto LAB_0013ccd0;
            }
            pcVar13 = "tRNS with alpha";
            goto LAB_0013cd11;
          }
          if (scan == 2) {
            s->img_n = 4;
            return 1;
          }
          if (uVar23 == 0) {
            pcVar13 = "tRNS before PLTE";
            goto LAB_0013cd11;
          }
          if (uVar23 < sVar9) {
LAB_0013cd7a:
            pcVar13 = "bad tRNS len";
            goto LAB_0013cd11;
          }
          for (uVar29 = 0; uVar19 != uVar29; uVar29 = uVar29 + 1) {
            sVar7 = stbi__get8(s);
            palette[uVar29 * 4 + 3] = sVar7;
          }
          bVar26 = 4;
          bVar31 = false;
          goto LAB_0013ccd0;
        }
      }
      else if (sVar10 == 0x49454e44) {
        if (!bVar31) {
          if (scan != 0) {
            return 1;
          }
          if (*ppsVar1 != (stbi_uc *)0x0) {
            raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
            psVar14 = (stbi_uc *)
                      stbi_zlib_decode_malloc_guesssize_headerflag
                                ((char *)*ppsVar1,uVar27,raw_len,(int *)&raw_len,(uint)!bVar3);
            z->expanded = psVar14;
            if (psVar14 == (stbi_uc *)0x0) {
              return 0;
            }
            free(z->idata);
            sVar9 = raw_len;
            z->idata = (stbi_uc *)0x0;
            iVar8 = s->img_n + 1;
            iVar17 = s->img_n;
            if (bVar4) {
              iVar17 = iVar8;
            }
            out_n = iVar17;
            if (req_comp != 3) {
              out_n = iVar8;
            }
            if (bVar26 != 0) {
              out_n = iVar17;
            }
            if (iVar8 != req_comp) {
              out_n = iVar17;
            }
            s->img_out_n = out_n;
            psVar14 = z->expanded;
            uVar23 = z->depth;
            local_458 = (ulong)uVar23;
            iVar8 = out_n << (uVar23 == 0x10);
            sVar10 = z->s->img_x;
            y = z->s->img_y;
            if (bVar5 == 0) {
              iVar8 = stbi__create_png_image_raw(z,psVar14,raw_len,out_n,sVar10,y,uVar23,color);
              if (iVar8 == 0) {
                return 0;
              }
            }
            else {
              psVar15 = (stbi_uc *)stbi__malloc_mad3(sVar10,y,iVar8,0);
              if (psVar15 == (stbi_uc *)0x0) {
                in_FS_OFFSET[-6] = (long)"outofmem";
                return 0;
              }
              sVar30 = (size_t)iVar8;
              for (lVar28 = 0; lVar28 != 7; lVar28 = lVar28 + 1) {
                psVar2 = z->s;
                uVar23 = (&DAT_00274090)[lVar28];
                uVar27 = (&DAT_002740d0)[lVar28];
                uVar22 = ~uVar23 + psVar2->img_x + uVar27;
                x = uVar22 / uVar27;
                uVar11 = (&DAT_002740b0)[lVar28];
                uVar24 = (&DAT_002740f0)[lVar28];
                uVar16 = ~uVar11 + psVar2->img_y + uVar24;
                y_00 = uVar16 / uVar24;
                if ((uVar27 <= uVar22) && (uVar24 <= uVar16)) {
                  depth = (int)local_458;
                  iVar17 = psVar2->img_n;
                  local_450 = lVar28;
                  local_448 = psVar14;
                  iVar12 = stbi__create_png_image_raw(z,psVar14,sVar9,out_n,x,y_00,depth,color);
                  if (iVar12 == 0) {
                    free(psVar15);
                    return 0;
                  }
                  uVar16 = (((int)(x * depth * iVar17 + 7) >> 3) + 1) * y_00;
                  local_440 = (long)(int)y_00;
                  iVar17 = uVar11 * iVar8;
                  for (lVar28 = 0; lVar28 < local_440; lVar28 = lVar28 + 1) {
                    psVar14 = psVar15 + (long)(int)uVar23 * sVar30;
                    for (lVar25 = 0; lVar25 < (int)x; lVar25 = lVar25 + 1) {
                      memcpy(psVar14 + z->s->img_x * iVar17,
                             z->out + (lVar28 * (int)x + lVar25) * sVar30,sVar30);
                      psVar14 = psVar14 + (long)(int)uVar27 * sVar30;
                    }
                    iVar17 = iVar17 + uVar24 * iVar8;
                  }
                  free(z->out);
                  psVar14 = local_448 + uVar16;
                  sVar9 = sVar9 - uVar16;
                  lVar28 = local_450;
                }
              }
              z->out = psVar15;
            }
            if (bVar4) {
              psVar14 = z->out;
              iVar8 = z->s->img_y * z->s->img_x;
              if (z->depth == 0x10) {
                if (s->img_out_n == 2) {
                  for (lVar28 = 0; iVar8 != (int)lVar28; lVar28 = lVar28 + 1) {
                    *(ushort *)(psVar14 + lVar28 * 4 + 2) =
                         -(ushort)(*(stbi__uint16 *)(psVar14 + lVar28 * 4) != tc16[0]);
                  }
                }
                else {
                  for (lVar28 = 0; iVar8 != (int)lVar28; lVar28 = lVar28 + 1) {
                    if (((*(stbi__uint16 *)(psVar14 + lVar28 * 8) == tc16[0]) &&
                        (*(stbi__uint16 *)(psVar14 + lVar28 * 8 + 2) == tc16[1])) &&
                       (*(stbi__uint16 *)(psVar14 + lVar28 * 8 + 4) == tc16[2])) {
                      (psVar14 + lVar28 * 8 + 6)[0] = '\0';
                      (psVar14 + lVar28 * 8 + 6)[1] = '\0';
                    }
                  }
                }
              }
              else if (s->img_out_n == 2) {
                for (lVar28 = 0; iVar8 != (int)lVar28; lVar28 = lVar28 + 1) {
                  psVar14[lVar28 * 2 + 1] = -(psVar14[lVar28 * 2] != tc[0]);
                }
              }
              else {
                for (lVar28 = 0; iVar8 != (int)lVar28; lVar28 = lVar28 + 1) {
                  if (((psVar14[lVar28 * 4] == tc[0]) && (psVar14[lVar28 * 4 + 1] == tc[1])) &&
                     (psVar14[lVar28 * 4 + 2] == tc[2])) {
                    psVar14[lVar28 * 4 + 3] = '\0';
                  }
                }
              }
            }
            if (bVar3) {
              piVar18 = &stbi__de_iphone_flag_global;
              if (*(int *)((long)in_FS_OFFSET + -0x14) != 0) {
                piVar18 = (int *)(*in_FS_OFFSET + -0x18);
              }
              if ((*piVar18 != 0) && (2 < s->img_out_n)) {
                psVar2 = z->s;
                psVar14 = z->out;
                iVar8 = psVar2->img_y * psVar2->img_x;
                if (psVar2->img_out_n == 3) {
                  while (bVar31 = iVar8 != 0, iVar8 = iVar8 + -1, bVar31) {
                    sVar7 = *psVar14;
                    *psVar14 = psVar14[2];
                    psVar14[2] = sVar7;
                    psVar14 = psVar14 + 3;
                  }
                }
                else {
                  piVar18 = &stbi__unpremultiply_on_load_global;
                  if (*(int *)((long)in_FS_OFFSET + -0x1c) != 0) {
                    piVar18 = (int *)(*in_FS_OFFSET + -0x20);
                  }
                  if (*piVar18 == 0) {
                    for (lVar28 = 0; iVar8 != (int)lVar28; lVar28 = lVar28 + 1) {
                      sVar7 = psVar14[lVar28 * 4];
                      psVar14[lVar28 * 4] = psVar14[lVar28 * 4 + 2];
                      psVar14[lVar28 * 4 + 2] = sVar7;
                    }
                  }
                  else {
                    for (lVar28 = 0; iVar8 != (int)lVar28; lVar28 = lVar28 + 1) {
                      bVar5 = psVar14[lVar28 * 4 + 3];
                      bVar6 = psVar14[lVar28 * 4];
                      if (bVar5 == 0) {
                        psVar14[lVar28 * 4] = psVar14[lVar28 * 4 + 2];
                        psVar14[lVar28 * 4 + 2] = bVar6;
                      }
                      else {
                        uVar23 = (uint)(bVar5 >> 1);
                        uVar21 = (ushort)bVar5;
                        psVar14[lVar28 * 4] =
                             (stbi_uc)(((uint)psVar14[lVar28 * 4 + 2] * 0xff + uVar23 & 0xffff) /
                                      (uint)uVar21);
                        psVar14[lVar28 * 4 + 1] =
                             (stbi_uc)(((uint)psVar14[lVar28 * 4 + 1] * 0xff + uVar23 & 0xffff) /
                                      (uint)uVar21);
                        psVar14[lVar28 * 4 + 2] =
                             (stbi_uc)(((uint)bVar6 * 0xff + uVar23 & 0xffff) / (uint)uVar21);
                      }
                    }
                  }
                }
              }
            }
            if (bVar26 == 0) {
              if (bVar4) {
                s->img_n = s->img_n + 1;
              }
LAB_0013d458:
              free(z->expanded);
              z->expanded = (stbi_uc *)0x0;
              stbi__get32be(s);
              return 1;
            }
            s->img_n = (uint)bVar26;
            uVar23 = (uint)bVar26;
            if (2 < req_comp) {
              uVar23 = req_comp;
            }
            s->img_out_n = uVar23;
            psVar14 = z->out;
            uVar27 = z->s->img_y * z->s->img_x;
            psVar15 = (stbi_uc *)stbi__malloc_mad2(uVar27,uVar23,0);
            if (psVar15 != (stbi_uc *)0x0) {
              uVar19 = 0;
              psVar20 = psVar15;
              if (uVar23 == 3) {
                for (; uVar27 != uVar19; uVar19 = uVar19 + 1) {
                  uVar29 = (ulong)psVar14[uVar19];
                  *psVar20 = palette[uVar29 * 4];
                  psVar20[1] = palette[uVar29 * 4 + 1];
                  psVar20[2] = palette[uVar29 * 4 + 2];
                  psVar20 = psVar20 + 3;
                }
              }
              else {
                for (; uVar27 != uVar19; uVar19 = uVar19 + 1) {
                  *(undefined4 *)(psVar15 + uVar19 * 4) =
                       *(undefined4 *)(palette + (ulong)psVar14[uVar19] * 4);
                }
              }
              free(psVar14);
              z->out = psVar15;
              goto LAB_0013d458;
            }
LAB_0013d413:
            pcVar13 = "outofmem";
            goto LAB_0013cd11;
          }
          pcVar13 = "no IDAT";
          goto LAB_0013cd11;
        }
      }
      else if (!bVar31) {
        bVar31 = false;
        if ((sVar10 >> 0x1d & 1) == 0) {
          stbi__parse_png_file::invalid_chunk._0_4_ =
               sVar10 >> 0x18 | (sVar10 & 0xff0000) >> 8 | (sVar10 & 0xff00) << 8 | sVar10 << 0x18;
          in_FS_OFFSET[-6] = (long)stbi__parse_png_file::invalid_chunk;
          return 0;
        }
        goto LAB_0013ca2b;
      }
LAB_0013cd0a:
      pcVar13 = "first not IHDR";
      goto LAB_0013cd11;
    }
    if (!bVar31) {
      pcVar13 = "multiple IHDR";
      goto LAB_0013cd11;
    }
    if (sVar9 != 0xd) {
      pcVar13 = "bad IHDR len";
      goto LAB_0013cd11;
    }
    sVar9 = stbi__get32be(s);
    s->img_x = sVar9;
    sVar9 = stbi__get32be(s);
    s->img_y = sVar9;
    if ((0x1000000 < sVar9) || (0x1000000 < s->img_x)) {
LAB_0013ccdd:
      pcVar13 = "too large";
LAB_0013cd11:
      in_FS_OFFSET[-6] = (long)pcVar13;
      return 0;
    }
    bVar5 = stbi__get8(s);
    z->depth = (uint)bVar5;
    if ((0x10 < bVar5) || ((0x10116U >> (bVar5 & 0x1f) & 1) == 0)) {
      pcVar13 = "1/2/4/8/16-bit only";
      goto LAB_0013cd11;
    }
    bVar6 = stbi__get8(s);
    if (6 < bVar6) {
LAB_0013ccef:
      pcVar13 = "bad ctype";
      goto LAB_0013cd11;
    }
    color = (uint)bVar6;
    if (bVar6 == 3) {
      bVar26 = 3;
      if (z->depth == 0x10) goto LAB_0013ccef;
    }
    else if ((bVar6 & 1) != 0) goto LAB_0013ccef;
    sVar7 = stbi__get8(s);
    if (sVar7 != '\0') {
      pcVar13 = "bad comp method";
      goto LAB_0013cd11;
    }
    sVar7 = stbi__get8(s);
    if (sVar7 != '\0') {
      pcVar13 = "bad filter method";
      goto LAB_0013cd11;
    }
    bVar5 = stbi__get8(s);
    if (1 < bVar5) {
      pcVar13 = "bad interlace method";
      goto LAB_0013cd11;
    }
    uVar24 = s->img_x;
    if ((uVar24 == 0) || (uVar16 = s->img_y, uVar16 == 0)) {
      pcVar13 = "0-pixel image";
      goto LAB_0013cd11;
    }
    if (bVar26 == 0) {
      uVar22 = (uint)(3 < bVar6) + (bVar6 & 2) + 1;
      s->img_n = uVar22;
      if ((uint)((0x40000000 / (ulong)uVar24) / (ulong)uVar22) < uVar16) goto LAB_0013ccdd;
      bVar31 = false;
      bVar26 = 0;
      if (scan == 2) {
        return 1;
      }
    }
    else {
      s->img_n = 1;
      bVar31 = false;
      if ((uint)(0x40000000 / (ulong)uVar24 >> 2) < uVar16) goto LAB_0013ccdd;
    }
  }
LAB_0013ccd0:
  stbi__get32be(s);
  goto LAB_0013c8bc;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}